

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::generateReferencedByShaderCaseBlocks
               (Context *context,TestCaseGroup *targetGroup,GLSLVersion glslVersion,
               _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_int *generateBlockContent)

{
  ShaderType SVar1;
  TestCaseGroup *pTVar2;
  Program *pPVar3;
  Shader *this;
  ShaderSet *pSVar4;
  char *name;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 local_160 [8];
  SharedPtr shaders_1;
  TestCaseGroup *blockGroup_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  string setName;
  char *stageName;
  ShaderSet *shaderSet_1;
  SharedPtr program_2;
  undefined1 local_a0 [4];
  int selectedStageBit;
  SharedPtr shaders;
  ShaderSet *shaderSet;
  SharedPtr program_1;
  TestCaseGroup *blockGroup_1;
  undefined1 local_68 [4];
  int pipelineNdx;
  SharedPtr stage;
  SharedPtr program;
  bool programSeparable;
  TestCaseGroup *blockGroup;
  int ndx;
  _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_int *generateBlockContent_local;
  GLSLVersion glslVersion_local;
  TestCaseGroup *targetGroup_local;
  Context *context_local;
  
  for (blockGroup._4_4_ = 0; blockGroup._4_4_ < 6; blockGroup._4_4_ = blockGroup._4_4_ + 1) {
    pTVar2 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup
              (pTVar2,context,
               generateReferencedByShaderCaseBlocks::singleStageCases[blockGroup._4_4_].name,"");
    SVar1 = generateReferencedByShaderCaseBlocks::singleStageCases[blockGroup._4_4_].stage;
    pPVar3 = (Program *)operator_new(0x28);
    ResourceDefinition::Program::Program(pPVar3,SVar1 != SHADERTYPE_COMPUTE);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&stage.m_state,(Node *)pPVar3);
    this = (Shader *)operator_new(0x28);
    ResourceDefinition::Shader::Shader
              (this,(SharedPtr *)&stage.m_state,
               generateReferencedByShaderCaseBlocks::singleStageCases[blockGroup._4_4_].stage,
               glslVersion);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_68,(Node *)this);
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar2);
    (*generateBlockContent)
              (context,(SharedPtr *)local_68,(TestCaseGroup *)pTVar2,
               generateReferencedByShaderCaseBlocks::singleStageCases[blockGroup._4_4_].expandLevel)
    ;
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_68);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&stage.m_state);
  }
  for (blockGroup_1._4_4_ = 0; blockGroup_1._4_4_ < 4; blockGroup_1._4_4_ = blockGroup_1._4_4_ + 1)
  {
    pTVar2 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup
              (pTVar2,context,
               generateReferencedByShaderCaseBlocks::pipelines[blockGroup_1._4_4_].name,"");
    program_1.m_state = (SharedPtrStateBase *)pTVar2;
    pPVar3 = (Program *)operator_new(0x28);
    ResourceDefinition::Program::Program(pPVar3,false);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&shaderSet,(Node *)pPVar3);
    pSVar4 = (ShaderSet *)operator_new(0x30);
    ResourceDefinition::ShaderSet::ShaderSet
              (pSVar4,(SharedPtr *)&shaderSet,glslVersion,
               generateReferencedByShaderCaseBlocks::pipelines[blockGroup_1._4_4_].flags,
               generateReferencedByShaderCaseBlocks::pipelines[blockGroup_1._4_4_].flags);
    shaders.m_state = (SharedPtrStateBase *)pSVar4;
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)program_1.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_a0,(Node *)shaders.m_state);
    (*generateBlockContent)
              (context,(SharedPtr *)local_a0,(TestCaseGroup *)program_1.m_state,
               generateReferencedByShaderCaseBlocks::pipelines[blockGroup_1._4_4_].expandLevel);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_a0);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&shaderSet);
    for (program_2.m_state._4_4_ = 0; program_2.m_state._4_4_ < 6;
        program_2.m_state._4_4_ = program_2.m_state._4_4_ + 1) {
      if ((generateReferencedByShaderCaseBlocks::pipelines[blockGroup_1._4_4_].flags &
          1 << ((byte)program_2.m_state._4_4_ & 0x1f)) != 0) {
        pPVar3 = (Program *)operator_new(0x28);
        ResourceDefinition::Program::Program(pPVar3,false);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)&shaderSet_1,(Node *)pPVar3);
        pSVar4 = (ShaderSet *)operator_new(0x30);
        ResourceDefinition::ShaderSet::ShaderSet
                  (pSVar4,(SharedPtr *)&shaderSet_1,glslVersion,
                   generateReferencedByShaderCaseBlocks::pipelines[blockGroup_1._4_4_].flags,
                   1 << (program_2.m_state._4_1_ & 0x1f));
        if (program_2.m_state._4_4_ == 0) {
          local_1b0 = "vertex";
        }
        else {
          if (program_2.m_state._4_4_ == 1) {
            local_1b8 = "fragment";
          }
          else {
            if (program_2.m_state._4_4_ == 2) {
              local_1c0 = "geo";
            }
            else {
              if (program_2.m_state._4_4_ == 3) {
                local_1c8 = "tess_ctrl";
              }
              else {
                local_1c8 = (char *)0x0;
                if (program_2.m_state._4_4_ == 4) {
                  local_1c8 = "tess_eval";
                }
              }
              local_1c0 = local_1c8;
            }
            local_1b8 = local_1c0;
          }
          local_1b0 = local_1b8;
        }
        setName.field_2._8_8_ = local_1b0;
        std::__cxx11::string::string((string *)&blockGroup_2);
        std::operator+(&local_128,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &blockGroup_2,
                       generateReferencedByShaderCaseBlocks::pipelines[blockGroup_1._4_4_].name);
        std::operator+(&local_108,&local_128,"_only_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8
                       ,&local_108,(char *)setName.field_2._8_8_);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&blockGroup_2);
        pTVar2 = (TestCaseGroup *)operator_new(0x78);
        name = (char *)std::__cxx11::string::c_str();
        TestCaseGroup::TestCaseGroup(pTVar2,context,name,"");
        shaders_1.m_state = (SharedPtrStateBase *)pTVar2;
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)local_160,(Node *)pSVar4);
        (*generateBlockContent)
                  (context,(SharedPtr *)local_160,(TestCaseGroup *)shaders_1.m_state,
                   generateReferencedByShaderCaseBlocks::pipelines[blockGroup_1._4_4_].
                   subExpandLevel);
        tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)shaders_1.m_state);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                    *)local_160);
        std::__cxx11::string::~string((string *)local_e8);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                    *)&shaderSet_1);
      }
    }
  }
  return;
}

Assistant:

static void generateReferencedByShaderCaseBlocks (Context& context, tcu::TestCaseGroup* const targetGroup, glu::GLSLVersion glslVersion, void (*generateBlockContent)(Context&, const ResourceDefinition::Node::SharedPtr&, tcu::TestCaseGroup*, int expandLevel))
{
	static const struct
	{
		const char*		name;
		glu::ShaderType	stage;
		int				expandLevel;
	} singleStageCases[] =
	{
		{ "compute",				glu::SHADERTYPE_COMPUTE,					3	},
		{ "separable_vertex",		glu::SHADERTYPE_VERTEX,						2	},
		{ "separable_fragment",		glu::SHADERTYPE_FRAGMENT,					2	},
		{ "separable_tess_ctrl",	glu::SHADERTYPE_TESSELLATION_CONTROL,		2	},
		{ "separable_tess_eval",	glu::SHADERTYPE_TESSELLATION_EVALUATION,	2	},
		{ "separable_geometry",		glu::SHADERTYPE_GEOMETRY,					2	},
	};
	static const struct
	{
		const char*	name;
		deUint32	flags;
		int			expandLevel;
		int			subExpandLevel;
	} pipelines[] =
	{
		{
			"vertex_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT),
			3,
			2,
		},
		{
			"vertex_tess_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_TESSELLATION_CONTROL) | (1 << glu::SHADERTYPE_TESSELLATION_EVALUATION),
			2,
			2,
		},
		{
			"vertex_geo_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_GEOMETRY),
			2,
			2,
		},
		{
			"vertex_tess_geo_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_TESSELLATION_CONTROL) | (1 << glu::SHADERTYPE_TESSELLATION_EVALUATION) | (1 << glu::SHADERTYPE_GEOMETRY),
			2,
			1,
		},
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(singleStageCases); ++ndx)
	{
		TestCaseGroup* const						blockGroup			= new TestCaseGroup(context, singleStageCases[ndx].name, "");
		const bool									programSeparable	= (singleStageCases[ndx].stage != glu::SHADERTYPE_COMPUTE);
		const ResourceDefinition::Node::SharedPtr	program				(new ResourceDefinition::Program(programSeparable));
		const ResourceDefinition::Node::SharedPtr	stage				(new ResourceDefinition::Shader(program, singleStageCases[ndx].stage, glslVersion));

		targetGroup->addChild(blockGroup);

		generateBlockContent(context, stage, blockGroup, singleStageCases[ndx].expandLevel);
	}

	for (int pipelineNdx = 0; pipelineNdx < DE_LENGTH_OF_ARRAY(pipelines); ++pipelineNdx)
	{
		// whole pipeline
		{
			TestCaseGroup* const						blockGroup			= new TestCaseGroup(context, pipelines[pipelineNdx].name, "");
			const ResourceDefinition::Node::SharedPtr	program				(new ResourceDefinition::Program());
			ResourceDefinition::ShaderSet*				shaderSet			= new ResourceDefinition::ShaderSet(program,
																												glslVersion,
																												pipelines[pipelineNdx].flags,
																												pipelines[pipelineNdx].flags);
			targetGroup->addChild(blockGroup);

			{
				const ResourceDefinition::Node::SharedPtr shaders(shaderSet);
				generateBlockContent(context, shaders, blockGroup, pipelines[pipelineNdx].expandLevel);
			}
		}

		// only one stage
		for (int selectedStageBit = 0; selectedStageBit < glu::SHADERTYPE_LAST; ++selectedStageBit)
		{
			if (pipelines[pipelineNdx].flags & (1 << selectedStageBit))
			{
				const ResourceDefinition::Node::SharedPtr	program		(new ResourceDefinition::Program());
				ResourceDefinition::ShaderSet*				shaderSet	= new ResourceDefinition::ShaderSet(program,
																											glslVersion,
																											pipelines[pipelineNdx].flags,
																											(1u << selectedStageBit));
				const char*									stageName	= (selectedStageBit == glu::SHADERTYPE_VERTEX)					? ("vertex")
																		: (selectedStageBit == glu::SHADERTYPE_FRAGMENT)				? ("fragment")
																		: (selectedStageBit == glu::SHADERTYPE_GEOMETRY)				? ("geo")
																		: (selectedStageBit == glu::SHADERTYPE_TESSELLATION_CONTROL)	? ("tess_ctrl")
																		: (selectedStageBit == glu::SHADERTYPE_TESSELLATION_EVALUATION)	? ("tess_eval")
																		: (DE_NULL);
				const std::string							setName		= std::string() + pipelines[pipelineNdx].name + "_only_" + stageName;
				TestCaseGroup* const						blockGroup	= new TestCaseGroup(context, setName.c_str(), "");
				const ResourceDefinition::Node::SharedPtr	shaders		(shaderSet);

				generateBlockContent(context, shaders, blockGroup, pipelines[pipelineNdx].subExpandLevel);
				targetGroup->addChild(blockGroup);
			}
		}
	}
}